

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O0

void __thiscall CaDiCaL::Queue::enqueue(Queue *this,Links *links,int idx)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int in_EDX;
  vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_> *in_RSI;
  int *in_RDI;
  Link *l;
  
  pvVar2 = std::vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_>::operator[]
                     (in_RSI,(long)in_EDX);
  iVar1 = in_RDI[1];
  pvVar2->prev = iVar1;
  if (iVar1 == 0) {
    *in_RDI = in_EDX;
  }
  else {
    pvVar3 = std::vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_>::operator[]
                       (in_RSI,(long)in_RDI[1]);
    pvVar3->next = in_EDX;
  }
  in_RDI[1] = in_EDX;
  pvVar2->next = 0;
  return;
}

Assistant:

inline void enqueue (Links &links, int idx) {
    Link &l = links[idx];
    if ((l.prev = last))
      links[last].next = idx;
    else
      first = idx;
    last = idx;
    l.next = 0;
  }